

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decContext.cpp
# Opt level: O1

char * uprv_decContextStatusToString_63(decContext *context)

{
  uint32_t uVar1;
  
  uVar1 = context->status;
  if ((int)uVar1 < 0x40) {
    switch(uVar1) {
    case 0:
      return "No status";
    case 1:
      return "Conversion syntax";
    case 2:
      return "Division by zero";
    case 3:
    case 5:
    case 6:
    case 7:
      break;
    case 4:
      return "Division impossible";
    case 8:
      return "Division undefined";
    default:
      if (uVar1 == 0x10) {
        return "Insufficient storage";
      }
      if (uVar1 == 0x20) {
        return "Inexact";
      }
    }
  }
  else if ((int)uVar1 < 0x400) {
    if (uVar1 == 0x40) {
      return "Invalid context";
    }
    if (uVar1 == 0x80) {
      return "Invalid operation";
    }
    if (uVar1 == 0x200) {
      return "Overflow";
    }
  }
  else if ((int)uVar1 < 0x1000) {
    if (uVar1 == 0x400) {
      return "Clamped";
    }
    if (uVar1 == 0x800) {
      return "Rounded";
    }
  }
  else {
    if (uVar1 == 0x1000) {
      return "Subnormal";
    }
    if (uVar1 == 0x2000) {
      return "Underflow";
    }
  }
  return "Multiple status";
}

Assistant:

U_CAPI const char * U_EXPORT2 uprv_decContextStatusToString(const decContext *context) {
  Int status=context->status;

  /* test the five IEEE first, as some of the others are ambiguous when  */
  /* DECEXTFLAG=0  */
  if (status==DEC_Invalid_operation    ) return DEC_Condition_IO;
  if (status==DEC_Division_by_zero     ) return DEC_Condition_DZ;
  if (status==DEC_Overflow             ) return DEC_Condition_OV;
  if (status==DEC_Underflow            ) return DEC_Condition_UN;
  if (status==DEC_Inexact              ) return DEC_Condition_IE;

  if (status==DEC_Division_impossible  ) return DEC_Condition_DI;
  if (status==DEC_Division_undefined   ) return DEC_Condition_DU;
  if (status==DEC_Rounded              ) return DEC_Condition_RO;
  if (status==DEC_Clamped              ) return DEC_Condition_PA;
  if (status==DEC_Subnormal            ) return DEC_Condition_SU;
  if (status==DEC_Conversion_syntax    ) return DEC_Condition_CS;
  if (status==DEC_Insufficient_storage ) return DEC_Condition_IS;
  if (status==DEC_Invalid_context      ) return DEC_Condition_IC;
  #if DECSUBSET
  if (status==DEC_Lost_digits          ) return DEC_Condition_LD;
  #endif
  if (status==0                        ) return DEC_Condition_ZE;
  return DEC_Condition_MU;  /* Multiple errors  */
  }